

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

Boolean llvm::isLegalUTF8(UTF8 *source,int length)

{
  byte *pbVar1;
  byte bVar2;
  UTF8 *pUVar3;
  UTF8 *local_28;
  UTF8 *srcptr;
  UTF8 a;
  int length_local;
  UTF8 *source_local;
  
  pUVar3 = source + length;
  local_28 = pUVar3;
  switch(length) {
  case 1:
    goto switchD_0028ab5c_caseD_1;
  case 2:
    goto switchD_0028ab5c_caseD_2;
  case 3:
    goto switchD_0028ab5c_caseD_3;
  case 4:
    local_28 = pUVar3 + -1;
    if ((pUVar3[-1] < 0x80) || (0xbf < pUVar3[-1])) {
      return '\0';
    }
switchD_0028ab5c_caseD_3:
    pbVar1 = local_28 + -1;
    if ((*pbVar1 < 0x80) || (local_28 = local_28 + -1, 0xbf < *pbVar1)) {
      source_local._7_1_ = '\0';
    }
    else {
switchD_0028ab5c_caseD_2:
      bVar2 = local_28[-1];
      if ((bVar2 < 0x80) || (0xbf < bVar2)) {
        source_local._7_1_ = '\0';
      }
      else {
        switch(*source) {
        case 0xe0:
          if (bVar2 < 0xa0) {
            return '\0';
          }
          break;
        default:
          if (bVar2 < 0x80) {
            return '\0';
          }
          break;
        case 0xed:
          if (0x9f < bVar2) {
            return '\0';
          }
          break;
        case 0xf0:
          if (bVar2 < 0x90) {
            return '\0';
          }
          break;
        case 0xf4:
          if (0x8f < bVar2) {
            return '\0';
          }
        }
switchD_0028ab5c_caseD_1:
        if ((*source < 0x80) || (0xc1 < *source)) {
          if (*source < 0xf5) {
            source_local._7_1_ = '\x01';
          }
          else {
            source_local._7_1_ = '\0';
          }
        }
        else {
          source_local._7_1_ = '\0';
        }
      }
    }
    return source_local._7_1_;
  default:
    return '\0';
  }
}

Assistant:

static Boolean isLegalUTF8(const UTF8 *source, int length) {
    UTF8 a;
    const UTF8 *srcptr = source+length;
    switch (length) {
    default: return false;
        /* Everything else falls through when "true"... */
    case 4: if ((a = (*--srcptr)) < 0x80 || a > 0xBF) return false;
    case 3: if ((a = (*--srcptr)) < 0x80 || a > 0xBF) return false;
    case 2: if ((a = (*--srcptr)) < 0x80 || a > 0xBF) return false;

        switch (*source) {
            /* no fall-through in this inner switch */
            case 0xE0: if (a < 0xA0) return false; break;
            case 0xED: if (a > 0x9F) return false; break;
            case 0xF0: if (a < 0x90) return false; break;
            case 0xF4: if (a > 0x8F) return false; break;
            default:   if (a < 0x80) return false;
        }

    case 1: if (*source >= 0x80 && *source < 0xC2) return false;
    }
    if (*source > 0xF4) return false;
    return true;
}